

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void golf_alloc_get_debug_info(size_t *total_size)

{
  _golf_alloc_info_t *p_Var1;
  size_t sVar2;
  _golf_alloc_info *p_Var3;
  
  golf_mutex_lock(&_alloc_lock);
  *total_size = 0;
  p_Var1 = head;
  sVar2 = 0;
  p_Var3 = head;
  while (p_Var3 = p_Var3->next, p_Var3 != p_Var1) {
    sVar2 = sVar2 + p_Var3->size;
    *total_size = sVar2;
  }
  golf_mutex_unlock(&_alloc_lock);
  return;
}

Assistant:

void golf_alloc_get_debug_info(size_t *total_size) {
    golf_mutex_lock(&_alloc_lock);
    *total_size = 0;
    _golf_alloc_info_t *info = head;
    while (info->next != head) {
        info = info->next;
        *total_size += info->size;
    }
    golf_mutex_unlock(&_alloc_lock);
}